

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_endsWith_Test::testBody(TEST_SimpleString_endsWith_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_d0;
  undefined1 local_c0 [8];
  SimpleString str4;
  undefined1 local_a0 [8];
  SimpleString str3;
  SimpleString local_80;
  undefined1 local_70 [8];
  SimpleString str2;
  SimpleString local_50;
  SimpleString local_40 [2];
  undefined1 local_20 [8];
  SimpleString str;
  TEST_SimpleString_endsWith_Test *this_local;
  
  str.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)local_20,"Hello World");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(local_40,"World");
  bVar1 = SimpleString::endsWith((SimpleString *)local_20,local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","str.endsWith(\"World\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a2,pTVar3);
  SimpleString::~SimpleString(local_40);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_50,"Worl");
  bVar1 = SimpleString::endsWith((SimpleString *)local_20,&local_50);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str.endsWith(\"Worl\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a3,pTVar3);
  SimpleString::~SimpleString(&local_50);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)&str2.bufferSize_,"Hello");
  bVar1 = SimpleString::endsWith((SimpleString *)local_20,(SimpleString *)&str2.bufferSize_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str.endsWith(\"Hello\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a4,pTVar3);
  SimpleString::~SimpleString((SimpleString *)&str2.bufferSize_);
  SimpleString::SimpleString((SimpleString *)local_70,"ah");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"ah");
  bVar1 = SimpleString::endsWith((SimpleString *)local_70,&local_80);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","str2.endsWith(\"ah\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a6,pTVar3);
  SimpleString::~SimpleString(&local_80);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)&str3.bufferSize_,"baah");
  bVar1 = SimpleString::endsWith((SimpleString *)local_70,(SimpleString *)&str3.bufferSize_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str2.endsWith(\"baah\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a7,pTVar3);
  SimpleString::~SimpleString((SimpleString *)&str3.bufferSize_);
  SimpleString::SimpleString((SimpleString *)local_a0,"");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)&str4.bufferSize_,"baah");
  bVar1 = SimpleString::endsWith((SimpleString *)local_a0,(SimpleString *)&str4.bufferSize_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str3.endsWith(\"baah\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a9,pTVar3);
  SimpleString::~SimpleString((SimpleString *)&str4.bufferSize_);
  SimpleString::SimpleString((SimpleString *)local_c0,"ha ha ha ha");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_d0,"ha");
  bVar1 = SimpleString::endsWith((SimpleString *)local_c0,&local_d0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","str4.endsWith(\"ha\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1ac,pTVar3);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString((SimpleString *)local_c0);
  SimpleString::~SimpleString((SimpleString *)local_a0);
  SimpleString::~SimpleString((SimpleString *)local_70);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(SimpleString, endsWith)
{
    SimpleString str("Hello World");
    CHECK(str.endsWith("World"));
    CHECK(!str.endsWith("Worl"));
    CHECK(!str.endsWith("Hello"));
    SimpleString str2("ah");
    CHECK(str2.endsWith("ah"));
    CHECK(!str2.endsWith("baah"));
    SimpleString str3("");
    CHECK(!str3.endsWith("baah"));

    SimpleString str4("ha ha ha ha");
    CHECK(str4.endsWith("ha"));
}